

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O1

int namingConventions::namingConventionsFunctions
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  AST *this;
  ulong uVar5;
  ulong uVar6;
  undefined8 name_00;
  vector<AST_*,_std::allocator<AST_*>_> functionNames;
  string name;
  vector<Pda_*,_std::allocator<Pda_*>_> functPdas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newVarNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allfunctNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  correctfunctNames;
  stringstream stream;
  pointer local_2e8;
  vector<AST_*,_std::allocator<AST_*>_> local_2e0;
  undefined1 local_2c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  long local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined8 local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_248;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_208;
  pointer local_200;
  string local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298 = 0;
  local_2a8._M_allocated_capacity = 0;
  local_2a8._8_8_ = 0;
  local_2e8 = (inputFiles->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_200 = (inputFiles->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_208 = inputFiles;
  if (local_2e8 != local_200) {
    do {
      local_288._M_allocated_capacity = 0;
      local_288._8_8_ = (string *)0x0;
      local_278 = 0;
      this = (AST *)operator_new(8);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      pcVar1 = (local_2e8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,pcVar1,pcVar1 + local_2e8->_M_string_length);
      AST::AST(this,&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"function-name","");
      AST::find(&local_2e0,this,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      name_00 = local_288._M_allocated_capacity;
      uVar2 = local_288._8_8_;
      if (local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          AST::yield_abi_cxx11_
                    ((string *)local_2c8,
                     local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5]);
          iVar4 = std::__cxx11::string::compare((char *)local_2c8);
          if (((iVar4 != 0) &&
              (iVar4 = std::__cxx11::string::compare((char *)local_2c8), iVar4 != 0)) &&
             (bVar3 = findNameInVector(&local_268,(string *)local_2c8), !bVar3)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_268,(string *)local_2c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_288,(string *)local_2c8);
          }
          if ((Pda *)local_2c8._0_8_ != (Pda *)(local_2c8 + 0x10)) {
            operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
          }
          bVar3 = uVar6 < (ulong)((long)local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3);
          uVar5 = uVar6;
          name_00 = local_288._M_allocated_capacity;
          uVar6 = (ulong)((int)uVar6 + 1);
          uVar2 = local_288._8_8_;
        } while (bVar3);
      }
      for (; name_00 != uVar2; name_00 = (string *)(name_00 + 0x20)) {
        local_2c8._0_8_ = makeNamePda((string *)name_00);
        std::vector<Pda*,std::allocator<Pda*>>::emplace_back<Pda*>
                  ((vector<Pda*,std::allocator<Pda*>> *)local_2a8._M_local_buf,(Pda **)local_2c8);
        pcVar1 = (((string *)name_00)->_M_dataplus)._M_p;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar1,pcVar1 + ((string *)name_00)->_M_string_length);
        correctName((string *)local_2c8,&local_1f8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8,
                   (string *)local_2c8);
        if ((Pda *)local_2c8._0_8_ != (Pda *)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_288);
      local_2e8 = local_2e8 + 1;
    } while (local_2e8 != local_200);
  }
  adjustForAllFiles(local_208,&local_268,(vector<Pda_*,_std::allocator<Pda_*>_> *)&local_2a8,false);
  if ((void *)local_2a8._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_2a8._M_allocated_capacity,local_298 - local_2a8._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return 0;
}

Assistant:

int namingConventions::namingConventionsFunctions(const std::vector<std::string> &inputFiles) {
    std::stringstream stream;
    std::vector<std::string> allfunctNames;
    std::vector<std::string> correctfunctNames;
    std::vector<Pda *> functPdas;

    for (const std::string &input: inputFiles) {

        std::vector<std::string> newVarNames;

        AST *ast = new AST(input);
//        ast->toDot("vbn/NamingConvTests/outputs/yeeters.dot");
        std::vector<AST *> functionNames = ast->find("function-name"); // all found functions

        for (unsigned int i = 0; i < functionNames.size(); ++i) {
            std::string name = functionNames[i]->yield();
            if (!(name == "true" || name == "false") && !findNameInVector(allfunctNames, name)) {
                allfunctNames.push_back(name);
                newVarNames.push_back(name);
            }
        }

        for (std::string &oldName: newVarNames) {
            functPdas.emplace_back(makeNamePda(oldName));
            correctfunctNames.push_back(correctName(oldName));
        }
    }
    adjustForAllFiles(inputFiles, allfunctNames, functPdas, false);

    return 0;
}